

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMultiProcessHandler::CheckGeneratedResourceSpec(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Base_ptr p_Var3;
  cmCTest *pcVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  size_type sVar7;
  ostream *poVar8;
  string error;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  
  p_Var1 = &(this->Properties).
            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  for (p_Var6 = (this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    p_Var3 = p_Var6[1]._M_parent;
    if (p_Var3[0x1c]._M_left != (_Base_ptr)0x0) {
      if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x613,error._M_dataplus._M_p,false);
        goto LAB_001df134;
      }
      if (p_Var3[0x16]._M_right != (_Base_ptr)&DAT_00000001) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "Test that defines GENERATED_RESOURCE_SPEC_FILE must have exactly one FIXTURES_SETUP"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x61b,error._M_dataplus._M_p,false);
        goto LAB_001df134;
      }
      bVar5 = cmsys::SystemTools::FileIsFullPath((string *)&p_Var3[0x1c]._M_parent);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "GENERATED_RESOURCE_SPEC_FILE must be an absolute path");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x623,error._M_dataplus._M_p,false);
        goto LAB_001df134;
      }
      _Var2 = p_Var6[1]._M_color;
      if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged == false) {
        (this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
      }
      (this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)(long)(int)_Var2;
      std::__cxx11::string::_M_assign((string *)&this->ResourceSpecSetupFixture);
    }
  }
  if ((this->ResourceSpecSetupFixture)._M_string_length != 0) {
    for (p_Var6 = (this->Properties).
                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      p_Var3 = p_Var6[1]._M_parent;
      if ((p_Var3[0x1b]._M_left != p_Var3[0x1b]._M_right) &&
         (sVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&p_Var3[0x18]._M_left,&this->ResourceSpecSetupFixture), sVar7 == 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "All tests that have RESOURCE_GROUPS must include the resource spec generator fixture in their FIXTURES_REQUIRED"
                                );
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar4 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x634,error._M_dataplus._M_p,false);
        goto LAB_001df134;
      }
    }
  }
  bVar5 = true;
  if ((this->ResourceSpecFile)._M_string_length != 0) {
    if ((this->ResourceSpecSetupTest).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "GENERATED_RESOURCE_SPEC_FILE test property cannot be used in conjunction with ResourceSpecFile option"
                              );
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x63f,error._M_dataplus._M_p,false);
LAB_001df134:
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else {
      error._M_dataplus._M_p = (pointer)&error.field_2;
      error._M_string_length = 0;
      error.field_2._M_local_buf[0] = '\0';
      bVar5 = InitResourceAllocator(this,&error);
      if (bVar5) {
        std::__cxx11::string::~string((string *)&error);
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&error);
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x644,local_1c0[0],false);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&error);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool cmCTestMultiProcessHandler::CheckGeneratedResourceSpec()
{
  for (auto& test : this->Properties) {
    if (!test.second->GeneratedResourceSpecFile.empty()) {
      if (this->ResourceSpecSetupTest) {
        cmCTestLog(
          this->CTest, ERROR_MESSAGE,
          "Only one test may define the GENERATED_RESOURCE_SPEC_FILE property"
            << std::endl);
        return false;
      }

      if (test.second->FixturesSetup.size() != 1) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Test that defines GENERATED_RESOURCE_SPEC_FILE must have "
                   "exactly one FIXTURES_SETUP"
                     << std::endl);
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(
            test.second->GeneratedResourceSpecFile)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "GENERATED_RESOURCE_SPEC_FILE must be an absolute path"
                     << std::endl);
        return false;
      }

      this->ResourceSpecSetupTest = test.first;
      this->ResourceSpecSetupFixture = *test.second->FixturesSetup.begin();
    }
  }

  if (!this->ResourceSpecSetupFixture.empty()) {
    for (auto& test : this->Properties) {
      if (!test.second->ResourceGroups.empty() &&
          !test.second->FixturesRequired.count(
            this->ResourceSpecSetupFixture)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "All tests that have RESOURCE_GROUPS must include the "
                   "resource spec generator fixture in their FIXTURES_REQUIRED"
                     << std::endl);
        return false;
      }
    }
  }

  if (!this->ResourceSpecFile.empty()) {
    if (this->ResourceSpecSetupTest) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "GENERATED_RESOURCE_SPEC_FILE test property cannot be used "
                 "in conjunction with ResourceSpecFile option"
                   << std::endl);
      return false;
    }
    std::string error;
    if (!this->InitResourceAllocator(error)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, error << std::endl);
      return false;
    }
  }

  return true;
}